

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O0

int32_t zng_gzgetc(gzFile file)

{
  byte *pbVar1;
  size_t sVar2;
  int *in_RDI;
  gz_state *state;
  uchar buf [1];
  uint local_24;
  undefined7 in_stack_ffffffffffffffe8;
  byte in_stack_ffffffffffffffef;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDI == (int *)0x0) {
    local_24 = 0xffffffff;
  }
  else if ((in_RDI[6] == 0x1c4f) && ((in_RDI[0x1d] == 0 || (in_RDI[0x1d] == -5)))) {
    if (*in_RDI == 0) {
      sVar2 = gz_read((gz_state *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                      in_RDI,CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
      if (sVar2 == 0) {
        local_24 = 0xffffffff;
      }
      else {
        local_24 = (uint)in_stack_ffffffffffffffef;
      }
    }
    else {
      *in_RDI = *in_RDI + -1;
      *(long *)(in_RDI + 4) = *(long *)(in_RDI + 4) + 1;
      pbVar1 = *(byte **)(in_RDI + 2);
      *(byte **)(in_RDI + 2) = pbVar1 + 1;
      local_24 = (uint)*pbVar1;
    }
  }
  else {
    local_24 = 0xffffffff;
  }
  return local_24;
}

Assistant:

int Z_EXPORT PREFIX(gzgetc)(gzFile file) {
    unsigned char buf[1];
    gz_state *state;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_state *)file;

    /* check that we're reading and that there's no (serious) error */
    if (state->mode != GZ_READ || (state->err != Z_OK && state->err != Z_BUF_ERROR))
        return -1;

    /* try output buffer (no need to check for skip request) */
    if (state->x.have) {
        state->x.have--;
        state->x.pos++;
        return *(state->x.next)++;
    }

    /* nothing there -- try gz_read() */
    return gz_read(state, buf, 1) < 1 ? -1 : buf[0];
}